

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

qpdf_offset_t QUtil::tell(FILE *stream)

{
  qpdf_offset_t qVar1;
  __off_t local_18;
  FILE *local_10;
  FILE *stream_local;
  
  local_10 = stream;
  local_18 = ftello((FILE *)stream);
  qVar1 = QIntC::to_offset<long>(&local_18);
  return qVar1;
}

Assistant:

qpdf_offset_t
QUtil::tell(FILE* stream)
{
#if HAVE_FSEEKO
    return QIntC::to_offset(ftello(stream));
#elif HAVE_FSEEKO64
    return QIntC::to_offset(ftello64(stream));
#else
# if defined _MSC_VER || defined __BORLANDC__
    return _ftelli64(stream);
# else
    return QIntC::to_offset(ftell(stream));
# endif
#endif
}